

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testoutput.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *profile;
  MOJOSHADER_error *pMVar1;
  FILE *__stream;
  uchar *tokenbuf;
  size_t sVar2;
  MOJOSHADER_parseData *_data;
  int i;
  long lVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  int local_54;
  
  if (argc < 3) {
    local_54 = 0;
    printf("\n\nUSAGE: %s <profile> [file1] ... [fileN]\n\n",*argv);
  }
  else {
    profile = argv[1];
    uVar6 = 2;
    local_54 = 0;
    do {
      __stream = fopen(argv[uVar6],"rb");
      if (__stream == (FILE *)0x0) {
        printf(" ... fopen(\'%s\') failed.\n",argv[uVar6]);
      }
      else {
        tokenbuf = (uchar *)malloc(1000000);
        sVar2 = fread(tokenbuf,1,1000000,__stream);
        fclose(__stream);
        _data = MOJOSHADER_parse(profile,(char *)0x0,tokenbuf,(uint)sVar2,(MOJOSHADER_swizzle *)0x0,
                                 0,(MOJOSHADER_samplerMap *)0x0,0,(MOJOSHADER_malloc)0x0,
                                 (MOJOSHADER_free)0x0,(void *)0x0);
        if (_data->error_count < 1) {
          if (_data->output != (char *)0x0) {
            if (0 < _data->output_len) {
              lVar3 = 0;
              do {
                putchar((int)_data->output[lVar3]);
                lVar3 = lVar3 + 1;
              } while (lVar3 < _data->output_len);
            }
            putchar(10);
          }
        }
        else {
          lVar5 = 0x10;
          lVar3 = 0;
          do {
            pMVar1 = _data->errors;
            pcVar4 = *(char **)((long)pMVar1 + lVar5 + -8);
            if (pcVar4 == (char *)0x0) {
              pcVar4 = "???";
            }
            printf("%s:%d: ERROR: %s\n",pcVar4,(ulong)*(uint *)((long)&pMVar1->error + lVar5),
                   *(undefined8 *)((long)pMVar1 + lVar5 + -0x10));
            lVar3 = lVar3 + 1;
            lVar5 = lVar5 + 0x18;
          } while (lVar3 < _data->error_count);
          local_54 = 1;
        }
        puts("\n");
        MOJOSHADER_freeParseData(_data);
        free(tokenbuf);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)argc);
  }
  return local_54;
}

Assistant:

int main(int argc, char **argv)
{
    int retval = 0;

    if (argc <= 2)
        printf("\n\nUSAGE: %s <profile> [file1] ... [fileN]\n\n", argv[0]);
    else
    {
        const char *profile = argv[1];
        int i;

        for (i = 2; i < argc; i++)
        {
            FILE *io = fopen(argv[i], "rb");
            if (io == NULL)
                printf(" ... fopen('%s') failed.\n", argv[i]);
            else
            {
                unsigned char *buf = (unsigned char *) malloc(1000000);
                int rc = fread(buf, 1, 1000000, io);
                fclose(io);
                if (!do_parse(buf, rc, profile))
                    retval = 1;
                free(buf);
            } // else
        } // for
    } // else

    return retval;
}